

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

int __thiscall
QTableViewPrivate::nextActiveVisualColumn
          (QTableViewPrivate *this,int row,int columnToStart,int limit,
          SearchDirection searchDirection)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QModelIndex local_68;
  undefined1 local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QHeaderView::logicalIndex(this->verticalHeader,row);
  if (searchDirection == Increasing) {
    if (columnToStart < limit) {
      iVar4 = columnToStart;
      do {
        columnToStart = iVar4;
        iVar4 = QHeaderView::logicalIndex(this->horizontalHeader,columnToStart);
        bVar2 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar4);
        if (!bVar2) {
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_68,&(this->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar1 + 0x60))(local_50,pQVar1,iVar3,iVar4,&local_68);
          pQVar1 = (this->super_QAbstractItemViewPrivate).model;
          uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,local_50);
          if ((uVar5 & 0x20) != 0) break;
        }
        iVar4 = columnToStart + 1;
        columnToStart = limit;
      } while (limit != iVar4);
    }
  }
  else if ((searchDirection == Decreasing) && (limit < columnToStart)) {
    iVar4 = columnToStart;
    do {
      columnToStart = iVar4;
      iVar4 = QHeaderView::logicalIndex(this->horizontalHeader,columnToStart);
      bVar2 = QHeaderView::isSectionHidden(this->horizontalHeader,iVar4);
      if (!bVar2) {
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_68,&(this->super_QAbstractItemViewPrivate).root);
        (**(code **)(*(long *)pQVar1 + 0x60))(local_50,pQVar1,iVar3,iVar4,&local_68);
        pQVar1 = (this->super_QAbstractItemViewPrivate).model;
        uVar5 = (**(code **)(*(long *)pQVar1 + 0x138))(pQVar1,local_50);
        if ((uVar5 & 0x20) != 0) break;
      }
      iVar4 = columnToStart + -1;
      columnToStart = limit;
    } while (limit < iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return columnToStart;
}

Assistant:

int QTableViewPrivate::nextActiveVisualColumn(int row, int columnToStart, int limit,
                                              SearchDirection searchDirection) const
{
    const int lr = logicalRow(row);
    int visualColumn = columnToStart;
    const auto isCellActive = [this](int lr, int vc)
    {
        const int lc = logicalColumn(vc);
        return !isColumnHidden(lc) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        while (visualColumn < limit && !isCellActive(lr, visualColumn))
            ++visualColumn;
        break;
    case SearchDirection::Decreasing:
        while (visualColumn > limit && !isCellActive(lr, visualColumn))
            --visualColumn;
        break;
    }
    return visualColumn;
}